

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acb.h
# Opt level: O2

void Acb_ManFree(Acb_Man_t *p)

{
  int *piVar1;
  void *__ptr;
  void **__ptr_00;
  Hash_IntMan_t *__ptr_01;
  void *__ptr_02;
  int i;
  
  for (i = 1; i < (p->vNtks).nSize; i = i + 1) {
    __ptr_02 = Vec_PtrEntry(&p->vNtks,i);
    Vec_IntErase((Vec_Int_t *)((long)__ptr_02 + 0x18));
    Vec_IntErase((Vec_Int_t *)((long)__ptr_02 + 0x28));
    Vec_IntErase((Vec_Int_t *)((long)__ptr_02 + 0x38));
    Vec_IntErase((Vec_Int_t *)((long)__ptr_02 + 0x48));
    Vec_StrErase((Vec_Str_t *)((long)__ptr_02 + 0x70));
    Vec_IntErase((Vec_Int_t *)((long)__ptr_02 + 0x80));
    Vec_IntErase((Vec_Int_t *)((long)__ptr_02 + 0x90));
    Vec_IntErase((Vec_Int_t *)((long)__ptr_02 + 0xa0));
    Vec_IntErase((Vec_Int_t *)((long)__ptr_02 + 0xb0));
    Vec_IntErase((Vec_Int_t *)((long)__ptr_02 + 0xc0));
    if (*(void **)((long)__ptr_02 + 0xd8) != (void *)0x0) {
      free(*(void **)((long)__ptr_02 + 0xd8));
      *(undefined8 *)((long)__ptr_02 + 0xd8) = 0;
    }
    *(undefined8 *)((long)__ptr_02 + 0xd0) = 0;
    Vec_IntErase((Vec_Int_t *)((long)__ptr_02 + 0xe0));
    Vec_IntErase((Vec_Int_t *)((long)__ptr_02 + 0xf0));
    Vec_IntErase((Vec_Int_t *)((long)__ptr_02 + 0x100));
    Vec_IntErase((Vec_Int_t *)((long)__ptr_02 + 0x110));
    Vec_IntErase((Vec_Int_t *)((long)__ptr_02 + 0x120));
    Vec_IntErase((Vec_Int_t *)((long)__ptr_02 + 0x130));
    Vec_IntErase((Vec_Int_t *)((long)__ptr_02 + 0x140));
    Vec_IntErase((Vec_Int_t *)((long)__ptr_02 + 0x150));
    Vec_IntErase((Vec_Int_t *)((long)__ptr_02 + 0x160));
    Vec_IntErase((Vec_Int_t *)((long)__ptr_02 + 0x170));
    Vec_IntErase((Vec_Int_t *)((long)__ptr_02 + 0x180));
    Vec_IntErase((Vec_Int_t *)((long)__ptr_02 + 400));
    if (*(void **)((long)__ptr_02 + 0x1a8) != (void *)0x0) {
      free(*(void **)((long)__ptr_02 + 0x1a8));
      *(undefined8 *)((long)__ptr_02 + 0x1a8) = 0;
    }
    *(undefined8 *)((long)__ptr_02 + 0x1a0) = 0;
    Vec_WecErase((Vec_Wec_t *)((long)__ptr_02 + 0x1b0));
    Vec_WecErase((Vec_Wec_t *)((long)__ptr_02 + 0x1c0));
    Vec_StrErase((Vec_Str_t *)((long)__ptr_02 + 0x1d0));
    Vec_IntErase((Vec_Int_t *)((long)__ptr_02 + 0x1e0));
    __ptr = *(void **)((long)__ptr_02 + 0x1f0);
    if (__ptr != (void *)0x0) {
      if (*(void **)((long)__ptr + 0x10) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x10));
        *(undefined8 *)((long)__ptr + 0x10) = 0;
      }
      free(*(void **)((long)__ptr + 8));
      free(__ptr);
    }
    *(undefined8 *)((long)__ptr_02 + 0x1f0) = 0;
    Vec_IntErase((Vec_Int_t *)((long)__ptr_02 + 0x1f8));
    Vec_IntErase((Vec_Int_t *)((long)__ptr_02 + 0x208));
    Vec_IntErase((Vec_Int_t *)((long)__ptr_02 + 0x218));
    Vec_IntErase((Vec_Int_t *)((long)__ptr_02 + 0x228));
    free(__ptr_02);
  }
  __ptr_00 = (p->vNtks).pArray;
  if (__ptr_00 != (void **)0x0) {
    free(__ptr_00);
    (p->vNtks).pArray = (void **)0x0;
  }
  Abc_NamDeref(p->pStrs);
  Abc_NamDeref(p->pFuns);
  Abc_NamDeref(p->pMods);
  __ptr_01 = p->vHash;
  if (__ptr_01 != (Hash_IntMan_t *)0x0) {
    piVar1 = &__ptr_01->nRefs;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Vec_IntFree(__ptr_01->vObjs);
      Vec_IntFree(__ptr_01->vTable);
      free(__ptr_01);
    }
  }
  Vec_IntErase(&p->vNameMap);
  Vec_IntErase(&p->vUsed);
  Vec_IntErase(&p->vNameMap2);
  Vec_IntErase(&p->vUsed2);
  Vec_StrErase(&p->vOut);
  Vec_StrErase(&p->vOut2);
  if (p->pName != (char *)0x0) {
    free(p->pName);
    p->pName = (char *)0x0;
  }
  free(p->pSpec);
  free(p);
  return;
}

Assistant:

static inline void Acb_ManFree( Acb_Man_t * p )
{
    Acb_Ntk_t * pNtk; int i;
    Acb_ManForEachNtk( p, pNtk, i )
        Acb_NtkFree( pNtk );
    ABC_FREE( p->vNtks.pArray );
    Abc_NamDeref( p->pStrs );
    Abc_NamDeref( p->pFuns );
    Abc_NamDeref( p->pMods );
    Hash_IntManDeref( p->vHash );
    Vec_IntErase( &p->vNameMap );
    Vec_IntErase( &p->vUsed );
    Vec_IntErase( &p->vNameMap2 );
    Vec_IntErase( &p->vUsed2 );
    Vec_StrErase( &p->vOut );
    Vec_StrErase( &p->vOut2 );
    ABC_FREE( p->pName );
    ABC_FREE( p->pSpec );
    ABC_FREE( p );
}